

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_endStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  uint uVar1;
  int iVar2;
  long in_RDI;
  size_t toFlush;
  size_t checksumSize;
  size_t lastBlockSize;
  size_t err_code;
  size_t remainingToFlush;
  ZSTD_inBuffer input;
  int local_5c;
  undefined8 in_stack_ffffffffffffffc0;
  ZSTD_inBuffer *in_stack_ffffffffffffffc8;
  size_t sVar3;
  ZSTD_CStream *in_stack_ffffffffffffffd0;
  ZSTD_CCtx *in_stack_ffffffffffffffd8;
  size_t local_8;
  
  inBuffer_forEndFlush(in_stack_ffffffffffffffd0);
  local_8 = ZSTD_compressStream2
                      (in_stack_ffffffffffffffd8,(ZSTD_outBuffer *)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8,
                       (ZSTD_EndDirective)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  sVar3 = local_8;
  uVar1 = ERR_isError(local_8);
  if ((uVar1 == 0) && (local_8 = sVar3, *(int *)(in_RDI + 0x134) < 1)) {
    iVar2 = 3;
    if (*(int *)(in_RDI + 0xe1c) != 0) {
      iVar2 = 0;
    }
    if (*(int *)(in_RDI + 0xe1c) == 0) {
      local_5c = *(int *)(in_RDI + 0x10c) << 2;
    }
    else {
      local_5c = 0;
    }
    local_8 = sVar3 + (long)iVar2 + (long)local_5c;
  }
  return local_8;
}

Assistant:

size_t ZSTD_endStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = inBuffer_forEndFlush(zcs);
    size_t const remainingToFlush = ZSTD_compressStream2(zcs, output, &input, ZSTD_e_end);
    FORWARD_IF_ERROR(remainingToFlush , "ZSTD_compressStream2(,,ZSTD_e_end) failed");
    if (zcs->appliedParams.nbWorkers > 0) return remainingToFlush;   /* minimal estimation */
    /* single thread mode : attempt to calculate remaining to flush more precisely */
    {   size_t const lastBlockSize = zcs->frameEnded ? 0 : ZSTD_BLOCKHEADERSIZE;
        size_t const checksumSize = (size_t)(zcs->frameEnded ? 0 : zcs->appliedParams.fParams.checksumFlag * 4);
        size_t const toFlush = remainingToFlush + lastBlockSize + checksumSize;
        DEBUGLOG(4, "ZSTD_endStream : remaining to flush : %u", (unsigned)toFlush);
        return toFlush;
    }
}